

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region_grow.cpp
# Opt level: O3

int rg::get_important_obstacles
              (RGProblem *problem,RGRegion *region,
              vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
              *obstacles)

{
  pointer pRVar1;
  undefined1 *puVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined7 extraout_var;
  Vector3i *dst;
  pointer pRVar6;
  Vector3i *upper_vertex;
  int *src;
  Vector3i local_28;
  Vector3i local_1c;
  
  pRVar6 = (region->region_bound_pts).super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (region->region_bound_pts).super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pRVar6 == pRVar1) {
    local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         -10000;
    local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         10000;
    local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         10000;
    local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         -10000;
    local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         10000;
    local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         -10000;
  }
  else {
    local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         10000;
    local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         -10000;
    local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         -10000;
    local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         10000;
    local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         -10000;
    local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         10000;
    do {
      iVar4 = (pRVar6->point).super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0];
      if (local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [0] < iVar4) {
        local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
             = iVar4;
      }
      if (iVar4 < local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[0]) {
        local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
             = iVar4;
      }
      iVar4 = (pRVar6->point).super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1];
      if (local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [1] < iVar4) {
        local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
             = iVar4;
      }
      if (iVar4 < local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[1]) {
        local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
             = iVar4;
      }
      iVar4 = (pRVar6->point).super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[2];
      if (local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [2] < iVar4) {
        local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
             = iVar4;
      }
      if (iVar4 < local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[2]) {
        local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
             = iVar4;
      }
      pRVar6 = pRVar6 + 1;
    } while (pRVar6 != pRVar1);
  }
  upper_vertex = &local_1c;
  iVar4 = RGProblem::getInnerObstacles(problem,upper_vertex,&local_28,obstacles);
  src = *(int **)(upper_vertex->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage
                 .m_data.array;
  puVar2 = *(undefined1 **)
            ((upper_vertex->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array + 2);
  if (src == (int *)puVar2) {
    uVar5 = (uint)CONCAT71((uint7)(uint3)((uint)iVar4 >> 8),1);
  }
  else {
    do {
      bVar3 = RGProblem::isObstacleOnPath(problem,(Vector3i *)src,dst,obstacles);
      if (bVar3) break;
      src = src + 4;
    } while (src != (int *)puVar2);
    uVar5 = (uint)CONCAT71(extraout_var,bVar3) ^ 1;
  }
  return uVar5;
}

Assistant:

int get_important_obstacles(const RGProblem &problem, const RGRegion &region, std::vector<Eigen::Vector3i> *obstacles)
{
  int max_x = -10000;
  int min_x = 10000; 
  int max_y = -10000;
  int min_y = 10000; 
  int max_z = -10000;
  int min_z = 10000;
  for (auto it = region.region_bound_pts.cbegin(); it != region.region_bound_pts.cend(); ++it)
  {
    if (it->point.x() > max_x)
      max_x = it->point.x();
    if (it->point.x() < min_x)
      min_x = it->point.x();
    if (it->point.y() > max_y)
      max_y = it->point.y();
    if (it->point.y() < min_y)
      min_y = it->point.y();
    if (it->point.z() > max_z)
      max_z = it->point.z();
    if (it->point.z() < min_z)
      min_z = it->point.z();
  }

  problem.getInnerObstacles(Eigen::Vector3i(max_x, max_y, max_z), Eigen::Vector3i(min_x, min_y, min_z), obstacles);

  return OK;
}